

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::sectionEnded
          (RunContext *this,SectionInfo *info,Counts *prevAssertions,double _durationInSeconds)

{
  ulong uVar1;
  TestCaseTracker *this_00;
  IStreamingReporter *pIVar2;
  SectionStats local_160;
  byte local_c9;
  undefined1 auStack_c8 [7];
  bool missingAssertions;
  Counts assertions;
  UnfinishedSections local_a8;
  double local_28;
  double _durationInSeconds_local;
  Counts *prevAssertions_local;
  SectionInfo *info_local;
  RunContext *this_local;
  
  local_28 = _durationInSeconds;
  _durationInSeconds_local = (double)prevAssertions;
  prevAssertions_local = (Counts *)info;
  info_local = (SectionInfo *)this;
  uVar1 = std::uncaught_exception();
  if ((uVar1 & 1) == 0) {
    _auStack_c8 = Counts::operator-(&(this->m_totals).assertions,(Counts *)_durationInSeconds_local)
    ;
    local_c9 = testForMissingAssertions(this,(Counts *)auStack_c8);
    this_00 = Option<Catch::SectionTracking::TestCaseTracker>::operator->(&this->m_testCaseTracker);
    SectionTracking::TestCaseTracker::leaveSection(this_00);
    pIVar2 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
    SectionStats::SectionStats
              (&local_160,(SectionInfo *)prevAssertions_local,(Counts *)auStack_c8,local_28,
               (bool)(local_c9 & 1));
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar2,&local_160);
    SectionStats::~SectionStats(&local_160);
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear(&this->m_messages);
  }
  else {
    UnfinishedSections::UnfinishedSections
              (&local_a8,(SectionInfo *)prevAssertions_local,(Counts *)_durationInSeconds_local,
               local_28);
    std::
    vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
    ::push_back(&this->m_unfinishedSections,&local_a8);
    UnfinishedSections::~UnfinishedSections(&local_a8);
  }
  return;
}

Assistant:

virtual void sectionEnded( SectionInfo const& info, Counts const& prevAssertions, double _durationInSeconds ) {
            if( std::uncaught_exception() ) {
                m_unfinishedSections.push_back( UnfinishedSections( info, prevAssertions, _durationInSeconds ) );
                return;
            }

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = testForMissingAssertions( assertions );

            m_testCaseTracker->leaveSection();

            m_reporter->sectionEnded( SectionStats( info, assertions, _durationInSeconds, missingAssertions ) );
            m_messages.clear();
        }